

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscache.cpp
# Opt level: O0

bool __thiscall QNetworkAccessCache::unlinkEntry(QNetworkAccessCache *this,QByteArray *key)

{
  Node *pNVar1;
  QByteArray *in_RDI;
  bool wasFirst;
  Node *node;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  bool local_1;
  
  pNVar1 = QHash<QByteArray,_QNetworkAccessCache::Node_*>::value
                     ((QHash<QByteArray,_QNetworkAccessCache::Node_*> *)
                      CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),in_RDI);
  if (pNVar1 == (Node *)0x0) {
    local_1 = false;
  }
  else {
    local_1 = pNVar1 == (Node *)in_RDI[1].d.d;
    if (local_1) {
      in_RDI[1].d.d = (Data *)pNVar1->next;
    }
    if (pNVar1 == (Node *)in_RDI[1].d.ptr) {
      in_RDI[1].d.ptr = (char *)pNVar1->previous;
    }
    if (pNVar1->previous != (Node *)0x0) {
      pNVar1->previous->next = pNVar1->next;
    }
    if (pNVar1->next != (Node *)0x0) {
      pNVar1->next->previous = pNVar1->previous;
    }
    pNVar1->previous = (Node *)0x0;
    pNVar1->next = (Node *)0x0;
  }
  return local_1;
}

Assistant:

bool QNetworkAccessCache::unlinkEntry(const QByteArray &key)
{
    Node * const node = hash.value(key);
    if (!node)
        return false;

    bool wasFirst = false;
    if (node == firstExpiringNode) {
        firstExpiringNode = node->next;
        wasFirst = true;
    }
    if (node == lastExpiringNode)
        lastExpiringNode = node->previous;
    if (node->previous)
        node->previous->next = node->next;
    if (node->next)
        node->next->previous = node->previous;

    node->next = node->previous = nullptr;
    return wasFirst;
}